

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_ep_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  inproc_ep *ep;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock(&nni_inproc.mx);
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_list_node_remove((nni_list_node *)((long)arg + 0x18));
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock(&nni_inproc.mx);
  return;
}

Assistant:

static void
inproc_ep_cancel(nni_aio *aio, void *arg, int rv)
{
	inproc_ep *ep = arg;

	nni_mtx_lock(&nni_inproc.mx);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_list_node_remove(&ep->node);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&nni_inproc.mx);
}